

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

s32 __thiscall
irr::video::CNullDriver::addMaterialRenderer
          (CNullDriver *this,IMaterialRenderer *renderer,char *name)

{
  uint uVar1;
  s32 sVar2;
  SMaterialRenderer r;
  
  if (renderer == (IMaterialRenderer *)0x0) {
    sVar2 = -1;
  }
  else {
    r.Name.str._M_dataplus._M_p = (pointer)&r.Name.str.field_2;
    r.Name.str._M_string_length = 0;
    r.Name.str.field_2._M_local_buf[0] = '\0';
    r.Renderer = renderer;
    core::string<char>::operator=(&r.Name,name);
    if ((name == (char *)0x0) &&
       (uVar1 = (uint)(((long)(this->MaterialRenderers).m_data.
                              super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->MaterialRenderers).m_data.
                             super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x28), uVar1 < 5)) {
      core::string<char>::operator=
                (&r.Name,*(char **)(sBuiltInMaterialTypeNames + (ulong)(uVar1 & 7) * 8));
    }
    core::array<irr::video::CNullDriver::SMaterialRenderer>::push_back(&this->MaterialRenderers,&r);
    *(int *)(&renderer->field_0x10 + (long)renderer->_vptr_IMaterialRenderer[-3]) =
         *(int *)(&renderer->field_0x10 + (long)renderer->_vptr_IMaterialRenderer[-3]) + 1;
    sVar2 = (int)(((long)(this->MaterialRenderers).m_data.
                         super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->MaterialRenderers).m_data.
                        super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x28) + -1;
    ::std::__cxx11::string::_M_dispose();
  }
  return sVar2;
}

Assistant:

s32 CNullDriver::addMaterialRenderer(IMaterialRenderer *renderer, const char *name)
{
	if (!renderer)
		return -1;

	SMaterialRenderer r;
	r.Renderer = renderer;
	r.Name = name;

	if (name == 0 && MaterialRenderers.size() < numBuiltInMaterials) {
		// set name of built in renderer so that we don't have to implement name
		// setting in all available renderers.
		r.Name = sBuiltInMaterialTypeNames[MaterialRenderers.size()];
	}

	MaterialRenderers.push_back(r);
	renderer->grab();

	return MaterialRenderers.size() - 1;
}